

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_count.hpp
# Opt level: O3

void __thiscall
optimization::ref_count::Ref_Count::DFS
          (Ref_Count *this,BasicBlk *startblk,
          set<int,_std::less<int>,_std::allocator<int>_> *visited,int pri,int next_pri)

{
  JumpKind JVar1;
  pointer puVar2;
  int iVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  mapped_type *pmVar7;
  int pri_00;
  pointer puVar8;
  uint32_t local_88 [2];
  undefined **local_80;
  key_type_conflict local_78 [2];
  _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  local_70;
  undefined **local_40;
  uint32_t local_38 [2];
  
  sVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(visited,&startblk->id);
  if (sVar4 == 0) {
    puVar8 = (startblk->inst).
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (startblk->inst).
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar8 != puVar2) {
      do {
        (*(((puVar8->_M_t).
            super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
            super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
          _vptr_Displayable[2])(&local_70);
        for (p_Var6 = local_70._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &local_70._M_impl.super__Rb_tree_header;
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          local_78[0] = *(key_type_conflict *)&p_Var6[1]._M_parent;
          local_80 = &PTR_display_001eb100;
          pmVar5 = std::
                   map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                   ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                 *)(*env + 0x38),local_78);
          pmVar5->priority = pmVar5->priority + pri;
        }
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree(&local_70);
        local_88[0] = (((puVar8->_M_t).
                        super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                        .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
        pmVar5 = std::
                 map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                 ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                               *)(*env + 0x38),local_88);
        pmVar5->priority = pmVar5->priority + pri;
        puVar8 = puVar8 + 1;
      } while (puVar8 != puVar2);
    }
    if ((startblk->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
        .super__Optional_payload_base<mir::inst::VarId>._M_engaged != false) {
      local_40 = &PTR_display_001eb100;
      local_38[0] = (startblk->jump).cond_or_ret.
                    super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
                    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
      pmVar5 = std::
               map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
               ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                             *)(*env + 0x38),local_38);
      pmVar5->priority = pmVar5->priority + pri;
    }
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)visited,
               &startblk->id);
    JVar1 = (startblk->jump).jump_kind;
    if (JVar1 == Branch) {
      iVar3 = pri / 2;
      pri_00 = this->min_weight;
      if (this->min_weight < iVar3) {
        pri_00 = iVar3;
      }
      if ((((startblk->jump).bb_false != -1) &&
          (pmVar7 = std::
                    map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                          *)(*env + 0x68),&(startblk->jump).bb_false),
          (pmVar7->jump).jump_kind == Undefined)) &&
         (pri = this->min_weight, this->min_weight < iVar3)) {
        pri = iVar3;
      }
    }
    else if (JVar1 == Loop) {
      pri_00 = this->loop_weight * pri;
      if (this->max_weight < pri_00) {
        pri_00 = this->max_weight;
      }
      iVar3 = pri / this->loop_weight;
      pri = this->min_weight;
      if (this->min_weight < iVar3) {
        pri = iVar3;
      }
    }
    else {
      pri_00 = pri;
      if ((startblk->jump).kind == Br) {
        pri_00 = next_pri;
      }
      if (next_pri == -1) {
        pri_00 = pri;
      }
    }
    if ((startblk->jump).bb_true != -1) {
      pmVar7 = std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)(*env + 0x68),&(startblk->jump).bb_true);
      DFS(this,pmVar7,visited,pri_00,-1);
    }
    if ((startblk->jump).bb_false != -1) {
      pmVar7 = std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)(*env + 0x68),&(startblk->jump).bb_false);
      DFS(this,pmVar7,visited,pri,-1);
    }
  }
  return;
}

Assistant:

void DFS(mir::inst::BasicBlk& startblk,
           std::set<mir::types::LabelId>& visited, int pri, int next_pri = -1) {
    if (visited.count(startblk.id)) {
      return;
    }
    for (auto& inst : startblk.inst) {
      for (auto var : inst->useVars()) {
        env->add_priority(var, pri);
      }
      env->add_priority(inst->dest, pri);
    }
    auto& jump = startblk.jump;
    if (jump.cond_or_ret.has_value()) {
      env->add_priority(jump.cond_or_ret.value(), pri);
    }
    visited.insert(startblk.id);
    int bb_true_pri = pri;
    int bb_false_pri = pri;
    int bb_true_next_pri = -1;
    int bb_false_next_pri = -1;
    if (startblk.jump.jump_kind == mir::inst::JumpKind::Loop) {
      bb_true_pri = std::min(pri * loop_weight, max_weight);
      bb_false_pri = std::max(pri / loop_weight, min_weight);
    } else if (jump.jump_kind == mir::inst::JumpKind::Branch) {
      bb_true_pri = std::max(pri / 2, min_weight);
      if (jump.bb_false != -1 &&
          env->func.basic_blks.at(jump.bb_false).jump.jump_kind ==
              mir::inst::JumpKind::Undefined) {
        bb_false_pri = std::max(pri / 2, min_weight);
        bb_true_next_pri = std::min(2 * pri, max_weight);
        bb_false_next_pri = std::min(2 * pri, max_weight);
      }
    } else {
      if (jump.kind == mir::inst::JumpInstructionKind::Br && next_pri != -1) {
        bb_true_pri = next_pri;
      }
    }
    if (jump.bb_true != -1) {
      DFS(env->func.basic_blks.at(jump.bb_true), visited, bb_true_pri);
    }
    if (jump.bb_false != -1) {
      DFS(env->func.basic_blks.at(jump.bb_false), visited, bb_false_pri);
    }
  }